

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::ColorTooltip(char *text,float *col,ImGuiColorEditFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImVec2 size;
  float fVar4;
  float fVar5;
  ImGuiContext *pIVar6;
  char *text_end;
  ulong uVar7;
  uint uVar8;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec4 local_48;
  ulong uVar9;
  
  pIVar6 = GImGui;
  fVar13 = *col;
  fVar1 = col[1];
  fVar12 = 1.0;
  if (fVar13 <= 1.0) {
    fVar12 = fVar13;
  }
  fVar4 = 1.0;
  if (fVar1 <= 1.0) {
    fVar4 = fVar1;
  }
  fVar2 = col[2];
  fVar5 = 1.0;
  if (fVar2 <= 1.0) {
    fVar5 = fVar2;
  }
  uVar7 = 0xff;
  if ((flags & 2U) == 0) {
    fVar3 = col[3];
    fVar14 = 1.0;
    if (fVar3 <= 1.0) {
      fVar14 = fVar3;
    }
    uVar7 = (ulong)(uint)(int)((float)(~-(uint)(fVar3 < 0.0) & (uint)fVar14) * 255.0 + 0.5);
  }
  text_end = (char *)0x0;
  BeginTooltipEx(0,true);
  if (text != (char *)0x0) {
    text_end = FindRenderedTextEnd(text,(char *)0x0);
  }
  if (text < text_end) {
    TextUnformatted(text,text_end);
    Separator();
  }
  uVar10 = (uint)((float)(~-(uint)(fVar13 < 0.0) & (uint)fVar12) * 255.0 + 0.5);
  uVar8 = (uint)((float)(~-(uint)(fVar1 < 0.0) & (uint)fVar4) * 255.0 + 0.5);
  uVar9 = (ulong)uVar8;
  uVar11 = (ulong)(uint)(int)((float)(~-(uint)(fVar2 < 0.0) & (uint)fVar5) * 255.0 + 0.5);
  fVar13 = (pIVar6->Style).FramePadding.y;
  fVar13 = pIVar6->FontSize * 3.0 + fVar13 + fVar13;
  local_48.x = col[0];
  local_48.y = col[1];
  local_48.z = col[2];
  local_48.w = col[3];
  size.y = fVar13;
  size.x = fVar13;
  ColorButton("##preview",&local_48,flags & 0x60002U | 0x40,size);
  SameLine(0.0,-1.0);
  if ((flags & 2U) == 0) {
    Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)",SUB84((double)*col,0)
         ,SUB84((double)col[1],0),SUB84((double)col[2],0),(double)col[3],(ulong)uVar10,uVar9,uVar11,
         uVar7,(ulong)uVar10,uVar9,uVar11,uVar7);
  }
  else {
    Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)",SUB84((double)*col,0),
         SUB84((double)col[1],0),SUB84((double)col[2],0),(ulong)uVar10,uVar9,uVar11,(ulong)uVar10,
         (ulong)uVar8,uVar11);
  }
  EndTooltip();
  return;
}

Assistant:

void ImGui::ColorTooltip(const char* text, const float* col, ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;

    int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
    BeginTooltipEx(0, true);

    const char* text_end = text ? FindRenderedTextEnd(text, NULL) : text;
    if (text_end > text)
    {
        TextUnformatted(text, text_end);
        Separator();
    }

    ImVec2 sz(g.FontSize * 3 + g.Style.FramePadding.y * 2, g.FontSize * 3 + g.Style.FramePadding.y * 2);
    ColorButton("##preview", ImVec4(col[0], col[1], col[2], col[3]), (flags & (ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf)) | ImGuiColorEditFlags_NoTooltip, sz);
    SameLine();
    if (flags & ImGuiColorEditFlags_NoAlpha)
        Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)", cr, cg, cb, cr, cg, cb, col[0], col[1], col[2]);
    else
        Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)", cr, cg, cb, ca, cr, cg, cb, ca, col[0], col[1], col[2], col[3]);
    EndTooltip();
}